

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O1

double basym(double *a,double *b,double *lambda,double *eps)

{
  double dVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  
  basym::basym = 0.0;
  dVar20 = *a;
  dVar1 = *b;
  if (dVar20 < dVar1) {
    basym::h = dVar20 / dVar1;
  }
  else {
    basym::h = dVar1 / dVar20;
  }
  dVar18 = dVar20;
  if (dVar20 >= dVar1) {
    dVar18 = dVar1;
  }
  basym::r0 = 1.0 / (basym::h + 1.0);
  basym::r1 = (dVar1 - dVar20) /
              (double)(~-(ulong)(dVar20 < dVar1) & (ulong)dVar20 |
                      -(ulong)(dVar20 < dVar1) & (ulong)dVar1);
  dVar18 = (basym::h + 1.0) * dVar18;
  if (dVar18 < 0.0) {
    dVar18 = sqrt(dVar18);
  }
  else {
    dVar18 = SQRT(dVar18);
  }
  basym::w0 = 1.0 / dVar18;
  basym::T1 = -*lambda / *a;
  basym::T2 = *lambda / *b;
  dVar20 = *a;
  dVar18 = rlog1(&basym::T1);
  dVar1 = *b;
  dVar19 = rlog1(&basym::T2);
  basym::f = dVar19 * dVar1 + dVar18 * dVar20;
  basym::t = exp(-basym::f);
  if ((basym::t != 0.0) || (NAN(basym::t))) {
    if (basym::f < 0.0) {
      basym::z0 = sqrt(basym::f);
    }
    else {
      basym::z0 = SQRT(basym::f);
    }
    basym::z = (basym::z0 / 0.353553390593274) * 0.5;
    basym::z2 = basym::f + basym::f;
    basym::a0[0] = basym::r1 * 0.6666666666666666;
    basym::d[0] = basym::a0[0] * 0.5;
    basym::c[0] = -basym::d[0];
    dVar20 = erfc1(&basym::K3,&basym::z0);
    dVar19 = basym::z2;
    dVar18 = basym::w0;
    dVar1 = basym::h;
    basym::j0 = dVar20 * 0.4431134627263801;
    basym::j1 = 0.353553390593274;
    basym::sum = basym::d[0] * basym::w0 * 0.353553390593274 + basym::j0;
    dVar21 = basym::h * basym::h;
    dVar22 = basym::r0 + basym::r0;
    dVar23 = basym::r1 + basym::r1;
    dVar20 = *eps;
    lVar10 = 3;
    lVar4 = 5;
    lVar16 = 0;
    dVar30 = 1.0;
    basym::s = 1.0;
    uVar12 = 2;
    dVar26 = basym::z;
    dVar29 = basym::z2;
    basym::w = basym::w0;
    do {
      dVar30 = dVar30 * dVar21;
      *(double *)(uVar12 * 8 + 0x1172e8) =
           ((dVar1 * dVar30 + 1.0) * dVar22) / (double)(int)(uVar12 + 2);
      basym::s = basym::s + dVar30;
      iVar2 = (int)uVar12;
      basym::a0[uVar12] = (basym::s * dVar23) / (double)(iVar2 + 3);
      dVar24 = basym::a0[0];
      lVar11 = lVar10;
      uVar13 = uVar12;
      lVar15 = lVar16;
      do {
        dVar27 = (double)(uVar13 + 1 & 0xffffffff);
        dVar25 = dVar27 * -0.5;
        basym::b0[0] = dVar25 * dVar24;
        lVar5 = 2;
        lVar6 = 1;
        pdVar9 = basym::b0;
        do {
          dVar28 = 0.0;
          iVar3 = 1;
          pdVar7 = basym::a0;
          pdVar8 = pdVar9;
          lVar14 = lVar6;
          do {
            dVar28 = dVar28 + ((double)iVar3 * dVar25 - (double)(int)lVar14) * *pdVar7 * *pdVar8;
            pdVar8 = pdVar8 + -1;
            pdVar7 = pdVar7 + 1;
            iVar3 = iVar3 + 1;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
          (&DAT_00117398)[lVar5] =
               *(double *)(lVar5 * 8 + 0x1172e8) * dVar25 + dVar28 / (double)(int)lVar5;
          lVar5 = lVar5 + 1;
          pdVar9 = pdVar9 + 1;
          lVar6 = lVar6 + 1;
        } while (lVar5 != lVar11);
        dVar27 = (double)(&DAT_00117398)[uVar13] / dVar27;
        pdVar9 = basym::c;
        *(double *)(uVar13 * 8 + 0x117448) = dVar27;
        dVar25 = 0.0;
        lVar5 = lVar15;
        do {
          dVar25 = dVar25 + *(double *)((long)basym::d + lVar5) * *pdVar9;
          lVar5 = lVar5 + -8;
          pdVar9 = pdVar9 + 1;
        } while (lVar5 != -8);
        (&DAT_001174f8)[uVar13] = -(dVar27 + dVar25);
        lVar11 = lVar11 + 1;
        lVar15 = lVar15 + 8;
        uVar13 = uVar13 + 1;
      } while (lVar11 != lVar4);
      basym::j0 = dVar26 * 0.353553390593274 + basym::j0 * (double)(iVar2 + -1);
      basym::j1 = dVar29 * 0.353553390593274 + basym::j1 * (double)iVar2;
      dVar24 = basym::w * dVar18;
      basym::w = dVar18 * dVar24;
      dVar24 = dVar24 * (double)(&DAT_001174f8)[uVar12] * basym::j0;
      dVar25 = basym::d[uVar12] * basym::w * basym::j1;
      basym::sum = basym::sum + dVar24 + dVar25;
      if (ABS(dVar25) + ABS(dVar24) <= dVar20 * basym::sum) break;
      dVar29 = dVar29 * dVar19;
      dVar26 = dVar26 * dVar19;
      lVar10 = lVar10 + 2;
      lVar4 = lVar4 + 2;
      lVar16 = lVar16 + 0x10;
      bVar17 = uVar12 < 0x13;
      uVar12 = uVar12 + 2;
    } while (bVar17);
    dVar20 = bcorr(a,b);
    dVar20 = exp(-dVar20);
    basym::basym = basym::t * 1.12837916709551 * dVar20 * basym::sum;
  }
  return basym::basym;
}

Assistant:

double basym(double *a,double *b,double *lambda,double *eps)
/*
-----------------------------------------------------------------------
     ASYMPTOTIC EXPANSION FOR IX(A,B) FOR LARGE A AND B.
     LAMBDA = (A + B)*Y - B  AND EPS IS THE TOLERANCE USED.
     IT IS ASSUMED THAT LAMBDA IS NONNEGATIVE AND THAT
     A AND B ARE GREATER THAN OR EQUAL TO 15.
-----------------------------------------------------------------------
*/
{
static double e0 = 1.12837916709551e0;
static double e1 = .353553390593274e0;
static int num = 20;
/*
------------------------
     ****** NUM IS THE MAXIMUM VALUE THAT N CAN TAKE IN THE DO LOOP
            ENDING AT STATEMENT 50. IT IS REQUIRED THAT NUM BE EVEN.
            THE ARRAYS A0, B0, C, D HAVE DIMENSION NUM + 1.
------------------------
     E0 = 2/SQRT(PI)
     E1 = 2**(-3/2)
------------------------
*/
static int K3 = 1;
static double basym,bsum,dsum,f,h,h2,hn,j0,j1,r,r0,r1,s,sum,t,t0,t1,u,w,w0,z,z0,
    z2,zn,znm1;
static int i,im1,imj,j,m,mm1,mmj,n,np1;
static double a0[21],b0[21],c[21],d[21],T1,T2;
/*
     ..
     .. Executable Statements ..
*/
    basym = 0.0e0;
    if(*a >= *b) goto S10;
    h = *a/ *b;
    r0 = 1.0e0/(1.0e0+h);
    r1 = (*b-*a)/ *b;
    w0 = 1.0e0/sqrt(*a*(1.0e0+h));
    goto S20;
S10:
    h = *b/ *a;
    r0 = 1.0e0/(1.0e0+h);
    r1 = (*b-*a)/ *a;
    w0 = 1.0e0/sqrt(*b*(1.0e0+h));
S20:
    T1 = -(*lambda/ *a);
    T2 = *lambda/ *b;
    f = *a*rlog1(&T1)+*b*rlog1(&T2);
    t = exp(-f);
    if(t == 0.0e0) return basym;
    z0 = sqrt(f);
    z = 0.5e0*(z0/e1);
    z2 = f+f;
    a0[0] = 2.0e0/3.0e0*r1;
    c[0] = -(0.5e0*a0[0]);
    d[0] = -c[0];
    j0 = 0.5e0/e0*erfc1(&K3,&z0);
    j1 = e1;
    sum = j0+d[0]*w0*j1;
    s = 1.0e0;
    h2 = h*h;
    hn = 1.0e0;
    w = w0;
    znm1 = z;
    zn = z2;
    for(n=2; n<=num; n+=2) {
        hn = h2*hn;
        a0[n-1] = 2.0e0*r0*(1.0e0+h*hn)/((double)n+2.0e0);
        np1 = n+1;
        s += hn;
        a0[np1-1] = 2.0e0*r1*s/((double)n+3.0e0);
        for(i=n; i<=np1; i++) {
            r = -(0.5e0*((double)i+1.0e0));
            b0[0] = r*a0[0];
            for(m=2; m<=i; m++) {
                bsum = 0.0e0;
                mm1 = m-1;
                for(j=1; j<=mm1; j++) {
                    mmj = m-j;
                    bsum += (((double)j*r-(double)mmj)*a0[j-1]*b0[mmj-1]);
                }
                b0[m-1] = r*a0[m-1]+bsum/(double)m;
            }
            c[i-1] = b0[i-1]/((double)i+1.0e0);
            dsum = 0.0e0;
            im1 = i-1;
            for(j=1; j<=im1; j++) {
                imj = i-j;
                dsum += (d[imj-1]*c[j-1]);
            }
            d[i-1] = -(dsum+c[i-1]);
        }
        j0 = e1*znm1+((double)n-1.0e0)*j0;
        j1 = e1*zn+(double)n*j1;
        znm1 = z2*znm1;
        zn = z2*zn;
        w = w0*w;
        t0 = d[n-1]*w*j0;
        w = w0*w;
        t1 = d[np1-1]*w*j1;
        sum += (t0+t1);
        if(fabs(t0)+fabs(t1) <= *eps*sum) goto S80;
    }
S80:
    u = exp(-bcorr(a,b));
    basym = e0*t*u*sum;
    return basym;
}